

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

double Catch::Benchmark::Detail::normal_quantile(double p)

{
  double dVar1;
  
  if (normal_quantile(double)::ROOT_TWO == '\0') {
    normal_quantile();
  }
  dVar1 = 0.0;
  if ((0.0 <= p) && (p <= 1.0)) {
    dVar1 = erfc_inv(p + p);
    dVar1 = -dVar1 * normal_quantile::ROOT_TWO;
  }
  return dVar1;
}

Assistant:

double normal_quantile(double p) {
                static const double ROOT_TWO = std::sqrt(2.0);

                double result = 0.0;
                assert(p >= 0 && p <= 1);
                if (p < 0 || p > 1) {
                    return result;
                }

                result = -erfc_inv(2.0 * p);
                // result *= normal distribution standard deviation (1.0) * sqrt(2)
                result *= /*sd * */ ROOT_TWO;
                // result += normal disttribution mean (0)
                return result;
            }